

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

void helics::BrokerFactory::terminateAllBrokers(void)

{
  bool bVar1;
  element_type *peVar2;
  shared_ptr<helics::Broker> *brk;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *__range2;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_> brokers
  ;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  milliseconds in_stack_ffffffffffffffb0;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
  local_28;
  undefined1 *local_20;
  undefined1 local_18 [24];
  
  getAllBrokers();
  local_20 = local_18;
  local_28._M_current =
       (shared_ptr<helics::Broker> *)
       CLI::std::
       vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
       begin((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
              *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  CLI::std::
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::end
            ((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
              *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                      ((__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                        *)in_stack_ffffffffffffffb0.__r,
                       (__normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
    ::operator*(&local_28);
    peVar2 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x5093e6);
    (*peVar2->_vptr_Broker[3])();
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<helics::Broker>_*,_std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>_>
    ::operator++(&local_28);
  }
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffb0,
             (int *)&stack0xffffffffffffffac);
  cleanUpBrokers(in_stack_ffffffffffffffb0);
  CLI::std::
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
  ~vector(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void terminateAllBrokers()
{
    auto brokers = getAllBrokers();
    for (auto& brk : brokers) {
        brk->disconnect();
    }
    cleanUpBrokers(std::chrono::milliseconds(250));
}